

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_proj.c
# Opt level: O1

int CVodeGetNumProjFails(void *cvode_mem,long *npfails)

{
  int iVar1;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  CVodeProjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeGetNumProjFails",&local_10,&local_18);
  if (iVar1 == 0) {
    *npfails = local_18->npfails;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumProjFails(void* cvode_mem, long int* npfails)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Get number of projection fails */
  *npfails = proj_mem->npfails;

  return (CV_SUCCESS);
}